

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexSetCookie(Fts5Index *p,int iNew)

{
  sqlite3_blob *local_30;
  sqlite3_blob *pBlob;
  Fts5Config *pFStack_20;
  u8 aCookie [4];
  Fts5Config *pConfig;
  int rc;
  int iNew_local;
  Fts5Index *p_local;
  
  pFStack_20 = p->pConfig;
  local_30 = (sqlite3_blob *)0x0;
  sqlite3Fts5Put32((u8 *)((long)&pBlob + 4),iNew);
  pConfig._0_4_ =
       sqlite3_blob_open(pFStack_20->db,pFStack_20->zDb,p->zDataTbl,"block",10,1,&local_30);
  if ((int)pConfig == 0) {
    sqlite3_blob_write(local_30,(void *)((long)&pBlob + 4),4,0);
    pConfig._0_4_ = sqlite3_blob_close(local_30);
  }
  return (int)pConfig;
}

Assistant:

static int sqlite3Fts5IndexSetCookie(Fts5Index *p, int iNew){
  int rc;                              /* Return code */
  Fts5Config *pConfig = p->pConfig;    /* Configuration object */
  u8 aCookie[4];                       /* Binary representation of iNew */
  sqlite3_blob *pBlob = 0;

  assert( p->rc==SQLITE_OK );
  sqlite3Fts5Put32(aCookie, iNew);

  rc = sqlite3_blob_open(pConfig->db, pConfig->zDb, p->zDataTbl, 
      "block", FTS5_STRUCTURE_ROWID, 1, &pBlob
  );
  if( rc==SQLITE_OK ){
    sqlite3_blob_write(pBlob, aCookie, 4, 0);
    rc = sqlite3_blob_close(pBlob);
  }

  return rc;
}